

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.h
# Opt level: O0

void __thiscall chrono::robosimian::RS_Part::~RS_Part(RS_Part *this)

{
  RS_Part *this_local;
  
  this->_vptr_RS_Part = (_func_int **)&PTR__RS_Part_002ed880;
  std::__cxx11::string::~string((string *)&this->m_mesh_name);
  std::vector<chrono::robosimian::MeshShape,_std::allocator<chrono::robosimian::MeshShape>_>::
  ~vector(&this->m_meshes);
  std::vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ::~vector(&this->m_cylinders);
  std::vector<chrono::robosimian::SphereShape,_std::allocator<chrono::robosimian::SphereShape>_>::
  ~vector(&this->m_spheres);
  std::vector<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>::~vector
            (&this->m_boxes);
  std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(&this->m_mat);
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr(&this->m_body);
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

virtual ~RS_Part() {}